

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-io.cpp
# Opt level: O2

ssize_t __thiscall wasm::ModuleReader::read(ModuleReader *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  ssize_t sVar2;
  undefined4 in_register_00000034;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string *psVar3;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          CONCAT44(in_register_00000034,__fd);
  if (__lhs->_M_string_length != 0) {
    bVar1 = std::operator==(__lhs,"-");
    if (!bVar1) {
      psVar3 = &local_90;
      std::__cxx11::string::string((string *)&local_90,(string *)__lhs);
      bVar1 = isBinaryFile((ModuleReader *)psVar3,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      if (bVar1) {
        psVar3 = &local_70;
        std::__cxx11::string::string((string *)psVar3,(string *)__lhs);
        std::__cxx11::string::string((string *)&local_50,(string *)__nbytes);
        readBinary(this,psVar3,(Module *)__buf,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
      }
      else {
        if (*(long *)(__nbytes + 8) != 0) {
          std::operator<<((ostream *)&std::cerr,
                          "Binaryen ModuleReader::read() - source map filename provided, but file appears to not be binary\n"
                         );
        }
        psVar3 = &local_b0;
        std::__cxx11::string::string((string *)psVar3,(string *)__lhs);
        readText(this,psVar3,(Module *)__buf);
      }
      goto LAB_00cd7bae;
    }
  }
  psVar3 = &local_d0;
  std::__cxx11::string::string((string *)psVar3,(string *)__nbytes);
  readStdin(this,(Module *)__buf,psVar3);
LAB_00cd7bae:
  sVar2 = std::__cxx11::string::~string((string *)psVar3);
  return sVar2;
}

Assistant:

void ModuleReader::read(std::string filename,
                        Module& wasm,
                        std::string sourceMapFilename) {
  // empty filename or "-" means read from stdin
  if (!filename.size() || filename == "-") {
    readStdin(wasm, sourceMapFilename);
    return;
  }
  if (isBinaryFile(filename)) {
    readBinary(filename, wasm, sourceMapFilename);
  } else {
    // default to text
    if (sourceMapFilename.size()) {
      std::cerr << "Binaryen ModuleReader::read() - source map filename "
                   "provided, but file appears to not be binary\n";
    }
    readText(filename, wasm);
  }
}